

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_path_excluded(archive *_a,archive_entry *entry)

{
  int iVar1;
  archive_match *in_RSI;
  archive *in_RDI;
  wchar_t magic_test;
  archive_match *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  archive_entry *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  wchar_t local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    local_4 = L'\xffffffe2';
  }
  else if (in_RSI == (archive_match *)0x0) {
    archive_set_error(in_RDI,0x16,"entry is NULL");
    local_4 = L'\xffffffe7';
  }
  else if ((in_RDI[1].magic & 1) == 0) {
    local_4 = L'\0';
  }
  else {
    archive_entry_pathname(in_stack_ffffffffffffffc8);
    local_4 = path_excluded(in_RSI,(wchar_t)((ulong)in_RDI >> 0x20),
                            (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  }
  return local_4;
}

Assistant:

int
archive_match_path_excluded(struct archive *_a,
    struct archive_entry *entry)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_path_excluded");

	a = (struct archive_match *)_a;
	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}

	/* If we don't have exclusion/inclusion pattern set at all,
	 * the entry is always not excluded. */
	if ((a->setflag & PATTERN_IS_SET) == 0)
		return (0);
#if defined(_WIN32) && !defined(__CYGWIN__)
	return (path_excluded(a, 0, archive_entry_pathname_w(entry)));
#else
	return (path_excluded(a, 1, archive_entry_pathname(entry)));
#endif
}